

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

UHashtable * udata_getHashTable(UErrorCode *err)

{
  UBool UVar1;
  UErrorCode UVar2;
  
  if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((gCommonDataCacheInitOnce.fState.super___atomic_base<int>._M_i == 2) ||
       (UVar1 = icu_63::umtx_initImplPreInit(&gCommonDataCacheInitOnce), UVar1 == '\0')) {
      if (U_ZERO_ERROR < gCommonDataCacheInitOnce.fErrCode) {
        *err = gCommonDataCacheInitOnce.fErrCode;
      }
    }
    else {
      gCommonDataCache =
           uhash_open_63(uhash_hashChars_63,uhash_compareChars_63,(undefined1 *)0x0,err);
      UVar2 = *err;
      if (UVar2 < U_ILLEGAL_ARGUMENT_ERROR) {
        uhash_setValueDeleter_63(gCommonDataCache,DataCacheElement_deleter);
        ucln_common_registerCleanup_63(UCLN_COMMON_UDATA,udata_cleanup);
        UVar2 = *err;
      }
      gCommonDataCacheInitOnce.fErrCode = UVar2;
      icu_63::umtx_initImplPostInit(&gCommonDataCacheInitOnce);
    }
  }
  return gCommonDataCache;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }